

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cc
# Opt level: O2

InterfacePortDef * __thiscall
kratos::InterfaceModPortDefinition::port
          (InterfacePortDef *__return_storage_ptr__,InterfaceModPortDefinition *this,string *name)

{
  element_type *peVar1;
  int iVar2;
  const_iterator cVar3;
  UserException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar4;
  string_view format_str;
  format_args args;
  undefined1 local_68 [32];
  pointer pcStack_48;
  PortDirection port_dir;
  PortType local_2c;
  
  iVar2 = (**(this->super_IDefinition)._vptr_IDefinition)(this,name);
  if ((char)iVar2 != '\0') {
    peVar1 = (this->def_).
             super___shared_ptr<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar2 = (**(peVar1->super_IDefinition)._vptr_IDefinition)(peVar1,name);
    if ((char)iVar2 == '\0') {
      peVar1 = (this->def_).
               super___shared_ptr<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (*(peVar1->super_IDefinition)._vptr_IDefinition[3])(local_68,peVar1,name);
      cVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(this->inputs_)._M_t,name);
      pcStack_48 = (pointer)CONCAT44(pcStack_48._4_4_,
                                     (uint)((_Rb_tree_header *)cVar3._M_node ==
                                           &(this->inputs_)._M_t._M_impl.super__Rb_tree_header));
      local_2c = Data;
      std::
      _Tuple_impl<0ul,unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>,kratos::PortDirection,kratos::PortType>
      ::
      _Tuple_impl<unsigned_int_const&,std::vector<unsigned_int,std::allocator<unsigned_int>>const&,kratos::PortDirection&,kratos::PortType,void>
                ((_Tuple_impl<0ul,unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>,kratos::PortDirection,kratos::PortType>
                  *)__return_storage_ptr__,(uint *)local_68,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_68 + 8),
                 (PortDirection *)&pcStack_48,&local_2c);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)(local_68 + 8));
    }
    else {
      peVar1 = (this->def_).
               super___shared_ptr<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (*(peVar1->super_IDefinition)._vptr_IDefinition[2])(__return_storage_ptr__,peVar1,name);
    }
    return __return_storage_ptr__;
  }
  this_00 = (UserException *)__cxa_allocate_exception(0x10);
  pcStack_48 = (name->_M_dataplus)._M_p;
  _port_dir = name->_M_string_length;
  bVar4 = fmt::v7::to_string_view<char,_0>("{0} does not exist");
  format_str.data_ = (char *)bVar4.size_;
  format_str.size_ = 0xd;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&pcStack_48;
  fmt::v7::detail::vformat_abi_cxx11_((string *)local_68,(detail *)bVar4.data_,format_str,args);
  UserException::UserException(this_00,(string *)local_68);
  __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

IDefinition::InterfacePortDef InterfaceModPortDefinition::port(const std::string& name) const {
    if (!has_port(name)) throw UserException(::format("{0} does not exist", name));
    if (def_->has_port(name)) {
        return def_->port(name);
    } else {
        // create a port def
        auto const& [width, size] = def_->var(name);
        auto port_dir =
            inputs_.find(name) != inputs_.end() ? PortDirection::In : PortDirection::Out;
        return std::make_tuple(width, size, port_dir, PortType::Data);
    }
}